

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32.cpp
# Opt level: O0

bech32_DecodedResult * bech32_create_DecodedResult(char *str)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  void *pvVar4;
  bech32_DecodedResult *hrpdp;
  size_t number_of_data_characters;
  size_t number_of_hrp_characters;
  size_t index_of_separator;
  allocator<char> local_39;
  string local_38 [8];
  string inputStr;
  char *str_local;
  
  if (str == (char *)0x0) {
    str_local = (char *)0x0;
  }
  else {
    inputStr.field_2._8_8_ = str;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_38,str,&local_39);
    std::allocator<char>::~allocator(&local_39);
    uVar1 = std::__cxx11::string::size();
    if (uVar1 < 8) {
      str_local = (char *)0x0;
    }
    else {
      lVar2 = std::__cxx11::string::find_first_of((char)local_38,0x31);
      if (lVar2 == -1) {
        str_local = (char *)0x0;
      }
      else {
        lVar3 = std::__cxx11::string::length();
        if ((lVar3 - lVar2) - 1U < 6) {
          str_local = (char *)0x0;
        }
        else {
          lVar3 = std::__cxx11::string::length();
          str_local = (char *)malloc(0x28);
          if (str_local == (char *)0x0) {
            str_local = (char *)0x0;
          }
          else {
            *(long *)(str_local + 0x10) = lVar2;
            pvVar4 = calloc(*(long *)(str_local + 0x10) + 1,1);
            *(void **)(str_local + 8) = pvVar4;
            if (*(long *)(str_local + 8) == 0) {
              free(str_local);
              str_local = (char *)0x0;
            }
            else {
              *(long *)(str_local + 0x20) = (lVar3 - lVar2) + -7;
              pvVar4 = calloc(*(size_t *)(str_local + 0x20),1);
              *(void **)(str_local + 0x18) = pvVar4;
              if (*(long *)(str_local + 0x18) == 0) {
                free(*(void **)(str_local + 8));
                free(str_local);
                str_local = (char *)0x0;
              }
              else {
                str_local[0] = '\0';
                str_local[1] = '\0';
                str_local[2] = '\0';
                str_local[3] = '\0';
              }
            }
          }
        }
      }
    }
    std::__cxx11::string::~string(local_38);
  }
  return (bech32_DecodedResult *)str_local;
}

Assistant:

bech32_DecodedResult * bech32_create_DecodedResult(const char *str) {
    if(str == nullptr)
        return nullptr;
    // the storage needed for a decoded bech32 string can be easily determined by the
    // length of the input string
    std::string inputStr(str);
    if(inputStr.size() < MIN_BECH32_LENGTH)
        return nullptr;
    size_t index_of_separator = inputStr.find_first_of(bech32::separator);
    if(index_of_separator == std::string::npos)
        return nullptr;
    size_t number_of_hrp_characters = index_of_separator;
    if(inputStr.length() - number_of_hrp_characters - 1 < bech32::limits::CHECKSUM_LENGTH)
        // not enough data characters
        return nullptr;
    size_t number_of_data_characters =
            inputStr.length()
            - number_of_hrp_characters
            - bech32::limits::SEPARATOR_LENGTH
            - bech32::limits::CHECKSUM_LENGTH;

    auto hrpdp = static_cast<bech32_DecodedResult *>(malloc(sizeof (bech32_DecodedResult)));
    if(hrpdp == nullptr)
        return nullptr;
    hrpdp->hrplen = number_of_hrp_characters;
    hrpdp->hrp = static_cast<char *>(calloc(hrpdp->hrplen+1, 1)); // +1 for '\0'
    if(hrpdp->hrp == nullptr) {
        free(hrpdp);
        return nullptr;
    }
    hrpdp->dplen = number_of_data_characters;
    hrpdp->dp = static_cast<unsigned char *>(calloc(hrpdp->dplen, 1));
    if(hrpdp->dp == nullptr) {
        free(hrpdp->hrp);
        free(hrpdp);
        return nullptr;
    }

    hrpdp->encoding = ENCODING_INVALID;

    return hrpdp;
}